

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DeadBranchElimPass::GetConstCondition
          (DeadBranchElimPass *this,uint32_t condId,bool *condVal)

{
  Op OVar1;
  bool bVar2;
  uint32_t condId_00;
  DefUseManager *this_00;
  Instruction *this_01;
  bool negVal;
  bool local_19;
  
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  this_01 = analysis::DefUseManager::GetDef(this_00,condId);
  OVar1 = this_01->opcode_;
  if (OVar1 == OpConstantTrue) {
    *condVal = true;
  }
  else {
    if (OVar1 != OpConstantFalse) {
      if (OVar1 == OpLogicalNot) {
        condId_00 = Instruction::GetSingleWordInOperand(this_01,0);
        bVar2 = GetConstCondition(this,condId_00,&local_19);
        if (!bVar2) {
          return bVar2;
        }
        *condVal = (bool)(local_19 ^ 1);
        return bVar2;
      }
      if (OVar1 != OpConstantNull) {
        return false;
      }
    }
    *condVal = false;
  }
  return true;
}

Assistant:

bool DeadBranchElimPass::GetConstCondition(uint32_t condId, bool* condVal) {
  bool condIsConst;
  Instruction* cInst = get_def_use_mgr()->GetDef(condId);
  switch (cInst->opcode()) {
    case spv::Op::OpConstantNull:
    case spv::Op::OpConstantFalse: {
      *condVal = false;
      condIsConst = true;
    } break;
    case spv::Op::OpConstantTrue: {
      *condVal = true;
      condIsConst = true;
    } break;
    case spv::Op::OpLogicalNot: {
      bool negVal;
      condIsConst =
          GetConstCondition(cInst->GetSingleWordInOperand(0), &negVal);
      if (condIsConst) *condVal = !negVal;
    } break;
    default: { condIsConst = false; } break;
  }
  return condIsConst;
}